

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool TwoBytesTest2<unsigned_long>(pfHash hash,int maxlen,bool drawDiagram)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  HashCallback<unsigned_long> c;
  
  c.m_hashes = &hashes;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.super_KeyCallback.m_count = 0;
  c.super_KeyCallback._vptr_KeyCallback = (_func_int **)&PTR__KeyCallback_001aade8;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_pfHash = hash;
  TwoBytesKeygen(maxlen,&c.super_KeyCallback);
  bVar1 = TestHashList<unsigned_long>(&hashes,drawDiagram,true,true,true,true);
  putchar(10);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return bVar1;
}

Assistant:

bool TwoBytesTest2 ( pfHash hash, int maxlen, bool drawDiagram )
{
  std::vector<hashtype> hashes;

  HashCallback<hashtype> c(hash,hashes);

  TwoBytesKeygen(maxlen,c);

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  return result;
}